

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall baseObject::~baseObject(baseObject *this)

{
  pointer pbVar1;
  pointer p_Var2;
  
  pbVar1 = (this->curves).super__Vector_base<bezierPoint,_std::allocator<bezierPoint>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pbVar1 != (pointer)0x0) {
    operator_delete(pbVar1);
  }
  p_Var2 = (this->points).super__Vector_base<_point,_std::allocator<_point>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (p_Var2 != (pointer)0x0) {
    operator_delete(p_Var2);
    return;
  }
  return;
}

Assistant:

baseObject::~baseObject()
{
}